

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void __thiscall
dg::dda::MemorySSATransformation::fillDefinitionsFromCall
          (MemorySSATransformation *this,Definitions *D,RWNodeCall *C)

{
  bool bVar1;
  RWNodeCall *in_RDX;
  Definitions *in_RSI;
  pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>
  *it2_1;
  const_iterator __end5;
  const_iterator __begin5;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *__range5;
  pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>
  *it2;
  const_iterator __end6;
  const_iterator __begin6;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *__range6;
  value_type *it;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  DefinitionsMap<dg::dda::RWNode> *__range4_2;
  SubgraphInfo *si;
  GenericDefSite<dg::dda::RWNode> *ds_1;
  iterator __end4_1;
  iterator __begin4_1;
  DefSiteSetT *__range4_1;
  GenericDefSite<dg::dda::RWNode> *ds;
  iterator __end4;
  iterator __begin4;
  DefSiteSetT *__range4;
  RWNode *called;
  RWSubgraph *subg;
  RWCalledValue *callee;
  iterator __end2;
  iterator __begin2;
  CalleesT *__range2;
  RWNode *in_stack_fffffffffffffe98;
  MemorySSATransformation *in_stack_fffffffffffffea0;
  Offset local_138 [3];
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_fffffffffffffee0;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> in_stack_fffffffffffffee8;
  const_iterator in_stack_fffffffffffffef0;
  const_iterator in_stack_fffffffffffffef8;
  _Self local_c8;
  _Self local_c0;
  DefSite *in_stack_ffffffffffffff48;
  RWNodeCall *in_stack_ffffffffffffff50;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  in_stack_ffffffffffffff58;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  in_stack_ffffffffffffff60;
  _Self local_80;
  _Self local_78;
  DefSiteSetT *local_70;
  reference local_68;
  _Self local_60;
  _Self local_58;
  DefSiteSetT *local_50;
  RWNode *local_48;
  RWSubgraph *local_40;
  RWCalledValue *local_38;
  RWCalledValue *local_30;
  __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
  local_28;
  CalleesT *local_20;
  RWNodeCall *local_18;
  Definitions *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = Definitions::isProcessed(in_RSI);
  if (!bVar1) {
    local_20 = RWNodeCall::getCallees(local_18);
    local_28._M_current =
         (RWCalledValue *)
         std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::begin
                   ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
                    in_stack_fffffffffffffe98);
    local_30 = (RWCalledValue *)
               std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::end
                         ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *
                          )in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                               *)in_stack_fffffffffffffe98), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                 ::operator*(&local_28);
      local_40 = RWCalledValue::getSubgraph(local_38);
      if (local_40 == (RWSubgraph *)0x0) {
        local_48 = RWCalledValue::getCalledValue(local_38);
        local_50 = RWNode::getDefines((RWNode *)0x17496c);
        local_58._M_node =
             (_Base_ptr)
             std::
             set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             ::begin((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                      *)in_stack_fffffffffffffe98);
        local_60._M_node =
             (_Base_ptr)
             std::
             set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             ::end((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                    *)in_stack_fffffffffffffe98);
        while (bVar1 = std::operator!=(&local_58,&local_60), bVar1) {
          local_68 = std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::
                     operator*((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *
                               )0x1749c6);
          fillDefinitionsFromCall
                    ((MemorySSATransformation *)in_stack_ffffffffffffff60._M_cur,
                     (Definitions *)in_stack_ffffffffffffff58._M_cur,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48);
          std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator++
                    ((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *)
                     in_stack_fffffffffffffea0);
        }
        local_70 = RWNode::getOverwrites((RWNode *)0x174a0c);
        local_78._M_node =
             (_Base_ptr)
             std::
             set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             ::begin((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                      *)in_stack_fffffffffffffe98);
        local_80._M_node =
             (_Base_ptr)
             std::
             set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             ::end((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                    *)in_stack_fffffffffffffe98);
        while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
          std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator*
                    ((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *)0x174a66)
          ;
          fillDefinitionsFromCall
                    ((MemorySSATransformation *)in_stack_ffffffffffffff60._M_cur,
                     (Definitions *)in_stack_ffffffffffffff58._M_cur,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48);
          std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator++
                    ((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *)
                     in_stack_fffffffffffffea0);
        }
      }
      else {
        getSubgraphInfo(in_stack_fffffffffffffea0,(RWSubgraph *)in_stack_fffffffffffffe98);
        computeModRef((MemorySSATransformation *)in_stack_ffffffffffffff60._M_cur,
                      (RWSubgraph *)in_stack_ffffffffffffff58._M_cur,
                      (SubgraphInfo *)in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff60._M_cur =
             (__node_type *)
             DefinitionsMap<dg::dda::RWNode>::begin
                       ((DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffe98);
        in_stack_ffffffffffffff58._M_cur =
             (__node_type *)
             DefinitionsMap<dg::dda::RWNode>::end
                       ((DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffe98);
        while (bVar1 = std::__detail::operator!=
                                 ((_Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
                                   *)&stack0xffffffffffffff60,
                                  (_Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
                                   *)&stack0xffffffffffffff58), bVar1) {
          in_stack_ffffffffffffff50 =
               (RWNodeCall *)
               std::__detail::
               _Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                            *)0x174b47);
          bVar1 = RWNode::isUnknown((RWNode *)(in_stack_ffffffffffffff50->super_RWNode)._vptr_RWNode
                                   );
          if (bVar1) {
            in_stack_ffffffffffffff48 =
                 (DefSite *)
                 &(in_stack_ffffffffffffff50->super_RWNode).super_SubgraphNode<dg::dda::RWNode>;
            local_c0._M_node =
                 (_Base_ptr)
                 ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::begin
                           ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)
                            in_stack_fffffffffffffe98);
            local_c8._M_node =
                 (_Base_ptr)
                 ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::end
                           ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)
                            in_stack_fffffffffffffe98);
            while (bVar1 = std::operator!=(&local_c0,&local_c8), bVar1) {
              std::
              _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
              ::operator*((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x174bd1);
              std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                        ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                         in_stack_fffffffffffffe98);
              __gnu_cxx::
              __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
              ::__normal_iterator<dg::dda::RWNode**>
                        ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                          *)in_stack_fffffffffffffe98);
              std::
              set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              ::begin((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                       *)in_stack_fffffffffffffe98);
              std::
              set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              ::end((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                     *)in_stack_fffffffffffffe98);
              std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
              insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>,void>
                        (in_stack_fffffffffffffee0,in_stack_fffffffffffffef8,
                         (_Rb_tree_const_iterator<dg::dda::RWNode_*>)
                         in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffee8);
              std::
              _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
              ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                            *)in_stack_fffffffffffffea0);
            }
          }
          else {
            in_stack_fffffffffffffef8._M_current =
                 (RWNode **)
                 ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::begin
                           ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)
                            in_stack_fffffffffffffe98);
            in_stack_fffffffffffffef0 =
                 ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::end
                           ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)
                            in_stack_fffffffffffffe98);
            while (bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffef8,
                                           (_Self *)&stack0xfffffffffffffef0), bVar1) {
              in_stack_fffffffffffffea0 =
                   (MemorySSATransformation *)
                   std::
                   _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                   ::operator*((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                                *)0x174cd3);
              in_stack_fffffffffffffe98 =
                   (RWNode *)(in_stack_ffffffffffffff50->super_RWNode)._vptr_RWNode;
              in_stack_fffffffffffffee8._M_node = (_Base_ptr)in_stack_fffffffffffffea0;
              local_138[0] = ADT::DiscreteInterval<dg::Offset>::length
                                       ((DiscreteInterval<dg::Offset> *)local_10);
              GenericDefSite<dg::dda::RWNode>::GenericDefSite
                        ((GenericDefSite<dg::dda::RWNode> *)(local_138 + 1),
                         in_stack_fffffffffffffe98,(Offset *)in_stack_fffffffffffffea0,local_138);
              fillDefinitionsFromCall
                        ((MemorySSATransformation *)in_stack_ffffffffffffff60._M_cur,
                         (Definitions *)in_stack_ffffffffffffff58._M_cur,in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48);
              std::
              _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
              ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                            *)in_stack_fffffffffffffea0);
            }
          }
          std::__detail::
          _Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
          ::operator++((_Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                        *)in_stack_fffffffffffffea0);
        }
      }
      __gnu_cxx::
      __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
      ::operator++(&local_28);
    }
    Definitions::setProcessed(local_10);
  }
  return;
}

Assistant:

void MemorySSATransformation::fillDefinitionsFromCall(Definitions &D,
                                                      RWNodeCall *C) {
    if (D.isProcessed()) {
        return;
    }

    DBG_SECTION_BEGIN(dda, "Finding all definitions for a call " << C);

    for (auto &callee : C->getCallees()) {
        auto *subg = callee.getSubgraph();
        if (!subg) {
            auto *called = callee.getCalledValue();
            for (const auto &ds : called->getDefines()) {
                fillDefinitionsFromCall(D, C, ds);
            }
            for (const auto &ds : called->getOverwrites()) {
                fillDefinitionsFromCall(D, C, ds);
            }
        } else {
            auto &si = getSubgraphInfo(subg);
            computeModRef(subg, si);
            assert(si.modref.isInitialized());

            for (const auto &it : si.modref.maydef) {
                if (it.first->isUnknown()) {
                    for (const auto &it2 : it.second) {
                        D.unknownWrites.insert(D.unknownWrites.end(),
                                               it2.second.begin(),
                                               it2.second.end());
                    }
                    continue;
                }
                for (const auto &it2 : it.second) {
                    fillDefinitionsFromCall(
                            D, C,
                            {it.first, it2.first.start, it2.first.length()});
                }
            }
        }
    }

    DBG_SECTION_BEGIN(dda, "Finding all definitions for a call "
                                   << C << " finished");
    D.setProcessed();
}